

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O2

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::FreeColSingletonPS::execute
          (FreeColSingletonPS *this,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *x,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *y,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *s,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *r,
          DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
          *cStatus,DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                   *rStatus,bool isOptimal)

{
  uint *puVar1;
  int iVar2;
  pointer pnVar3;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar4;
  type_conflict5 tVar5;
  bool bVar6;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *b;
  long lVar7;
  int k;
  long lVar8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  scale;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  val;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  z;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_3;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  aij;
  cpp_dec_float<100U,_int,_void> local_358;
  cpp_dec_float<100U,_int,_void> local_308;
  cpp_dec_float<100U,_int,_void> local_2b8;
  cpp_dec_float<100U,_int,_void> local_268;
  cpp_dec_float<100U,_int,_void> local_218;
  cpp_dec_float<100U,_int,_void> local_1c8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_178;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  int local_98;
  undefined1 local_94;
  undefined8 local_90;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_80;
  
  if (this->m_i != this->m_old_i) {
    pnVar3 = (s->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
              (&pnVar3[this->m_old_i].m_backend,&pnVar3[this->m_i].m_backend);
    pnVar3 = (y->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
              (&pnVar3[this->m_old_i].m_backend,&pnVar3[this->m_i].m_backend);
    rStatus->data[this->m_old_i] = rStatus->data[this->m_i];
  }
  b = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
       *)(long)this->m_j;
  if (this->m_j != this->m_old_j) {
    pnVar3 = (x->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
              (&pnVar3[this->m_old_j].m_backend,&pnVar3[(long)b].m_backend);
    pnVar3 = (r->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
              (&pnVar3[this->m_old_j].m_backend,&pnVar3[this->m_j].m_backend);
    b = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
         *)cStatus->data;
    (b->m_backend).data._M_elems[this->m_old_j] = (b->m_backend).data._M_elems[this->m_j];
  }
  lVar7 = 0;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
            (&local_308,0.0,(type *)0x0);
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::operator[]((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&local_1c8,
               &(this->m_row).
                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ,this->m_j);
  for (lVar8 = 0;
      lVar8 < (this->m_row).
              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .memused; lVar8 = lVar8 + 1) {
    pNVar4 = (this->m_row).
             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .m_elem;
    iVar2 = *(int *)((long)(&pNVar4->val + 1) + lVar7);
    if (iVar2 != this->m_j) {
      local_358.fpclass = cpp_dec_float_finite;
      local_358.prec_elem = 0x10;
      local_358.data._M_elems[0] = 0;
      local_358.data._M_elems[1] = 0;
      local_358.data._M_elems[2] = 0;
      local_358.data._M_elems[3] = 0;
      local_358.data._M_elems[4] = 0;
      local_358.data._M_elems[5] = 0;
      local_358.data._M_elems[6] = 0;
      local_358.data._M_elems[7] = 0;
      local_358.data._M_elems[8] = 0;
      local_358.data._M_elems[9] = 0;
      local_358.data._M_elems[10] = 0;
      local_358.data._M_elems[0xb] = 0;
      local_358.data._M_elems[0xc] = 0;
      local_358.data._M_elems[0xd] = 0;
      local_358.data._M_elems._56_5_ = 0;
      local_358.data._M_elems[0xf]._1_3_ = 0;
      local_358.exp = 0;
      local_358.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                (&local_358,
                 (cpp_dec_float<100U,_int,_void> *)
                 ((long)(pNVar4->val).m_backend.data._M_elems + lVar7),
                 &(x->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar2].m_backend);
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                (&local_308,&local_358);
    }
    lVar7 = lVar7 + 0x54;
  }
  local_d8 = *(undefined8 *)(this->m_lRhs).m_backend.data._M_elems;
  uStack_d0 = *(undefined8 *)((this->m_lRhs).m_backend.data._M_elems + 2);
  local_c8 = *(undefined8 *)((this->m_lRhs).m_backend.data._M_elems + 4);
  uStack_c0 = *(undefined8 *)((this->m_lRhs).m_backend.data._M_elems + 6);
  local_b8 = *(undefined8 *)((this->m_lRhs).m_backend.data._M_elems + 8);
  uStack_b0 = *(undefined8 *)((this->m_lRhs).m_backend.data._M_elems + 10);
  local_a8 = *(undefined8 *)((this->m_lRhs).m_backend.data._M_elems + 0xc);
  uStack_a0 = *(undefined8 *)((this->m_lRhs).m_backend.data._M_elems + 0xe);
  local_98 = (this->m_lRhs).m_backend.exp;
  local_94 = (this->m_lRhs).m_backend.neg;
  local_90._0_4_ = (this->m_lRhs).m_backend.fpclass;
  local_90._4_4_ = (this->m_lRhs).m_backend.prec_elem;
  local_128.m_backend.data._M_elems[0] = local_308.data._M_elems[0];
  local_128.m_backend.data._M_elems[1] = local_308.data._M_elems[1];
  local_128.m_backend.data._M_elems[2] = local_308.data._M_elems[2];
  local_128.m_backend.data._M_elems[3] = local_308.data._M_elems[3];
  local_128.m_backend.data._M_elems[4] = local_308.data._M_elems[4];
  local_128.m_backend.data._M_elems[5] = local_308.data._M_elems[5];
  local_128.m_backend.data._M_elems[6] = local_308.data._M_elems[6];
  local_128.m_backend.data._M_elems[7] = local_308.data._M_elems[7];
  local_128.m_backend.data._M_elems[8] = local_308.data._M_elems[8];
  local_128.m_backend.data._M_elems[9] = local_308.data._M_elems[9];
  local_128.m_backend.data._M_elems[10] = local_308.data._M_elems[10];
  local_128.m_backend.data._M_elems[0xb] = local_308.data._M_elems[0xb];
  local_128.m_backend.data._M_elems[0xc] = local_308.data._M_elems[0xc];
  local_128.m_backend.data._M_elems[0xd] = local_308.data._M_elems[0xd];
  local_128.m_backend.data._M_elems[0xe] = local_308.data._M_elems[0xe];
  local_128.m_backend.data._M_elems[0xf] = local_308.data._M_elems[0xf];
  local_128.m_backend.exp = local_308.exp;
  local_128.m_backend.neg = local_308.neg;
  local_128.m_backend.fpclass = local_308.fpclass;
  local_128.m_backend.prec_elem = local_308.prec_elem;
  maxAbs<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>
            ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)&local_358,(soplex *)&local_d8,&local_128,b);
  local_2b8.data._M_elems[0] = 0;
  local_2b8.data._M_elems[1] = 0x3ff00000;
  tVar5 = boost::multiprecision::operator<
                    ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_358,(double *)&local_2b8);
  if (tVar5) {
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)&local_358,1.0);
  }
  local_268.fpclass = cpp_dec_float_finite;
  local_268.prec_elem = 0x10;
  local_268.data._M_elems[0] = 0;
  local_268.data._M_elems[1] = 0;
  local_268.data._M_elems[2] = 0;
  local_268.data._M_elems[3] = 0;
  local_268.data._M_elems[4] = 0;
  local_268.data._M_elems[5] = 0;
  local_268.data._M_elems[6] = 0;
  local_268.data._M_elems[7] = 0;
  local_268.data._M_elems[8] = 0;
  local_268.data._M_elems[9] = 0;
  local_268.data._M_elems[10] = 0;
  local_268.data._M_elems[0xb] = 0;
  local_268.data._M_elems[0xc] = 0;
  local_268.data._M_elems[0xd] = 0;
  local_268.data._M_elems._56_5_ = 0;
  local_268.data._M_elems[0xf]._1_3_ = 0;
  local_268.exp = 0;
  local_268.neg = false;
  boost::multiprecision::default_ops::
  eval_divide_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
            (&local_268,&(this->m_lRhs).m_backend,&local_358);
  local_218.fpclass = cpp_dec_float_finite;
  local_218.prec_elem = 0x10;
  local_218.data._M_elems[0] = 0;
  local_218.data._M_elems[1] = 0;
  local_218.data._M_elems[2] = 0;
  local_218.data._M_elems[3] = 0;
  local_218.data._M_elems[4] = 0;
  local_218.data._M_elems[5] = 0;
  local_218.data._M_elems[6] = 0;
  local_218.data._M_elems[7] = 0;
  local_218.data._M_elems[8] = 0;
  local_218.data._M_elems[9] = 0;
  local_218.data._M_elems[10] = 0;
  local_218.data._M_elems[0xb] = 0;
  local_218.data._M_elems[0xc] = 0;
  local_218.data._M_elems[0xd] = 0;
  local_218.data._M_elems._56_5_ = 0;
  local_218.data._M_elems[0xf]._1_3_ = 0;
  local_218.exp = 0;
  local_218.neg = false;
  boost::multiprecision::default_ops::
  eval_divide_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
            (&local_218,&local_308,&local_358);
  local_2b8.fpclass = cpp_dec_float_finite;
  local_2b8.prec_elem = 0x10;
  local_2b8.data._M_elems[0] = 0;
  local_2b8.data._M_elems[1] = 0;
  local_2b8.data._M_elems[2] = 0;
  local_2b8.data._M_elems[3] = 0;
  local_2b8.data._M_elems[4] = 0;
  local_2b8.data._M_elems[5] = 0;
  local_2b8.data._M_elems[6] = 0;
  local_2b8.data._M_elems[7] = 0;
  local_2b8.data._M_elems[8] = 0;
  local_2b8.data._M_elems[9] = 0;
  local_2b8.data._M_elems[10] = 0;
  local_2b8.data._M_elems[0xb] = 0;
  local_2b8.data._M_elems[0xc] = 0;
  local_2b8.data._M_elems[0xd] = 0;
  local_2b8.data._M_elems[0xe] = 0;
  local_2b8.data._M_elems[0xf] = 0;
  local_2b8.exp = 0;
  local_2b8.neg = false;
  boost::multiprecision::default_ops::
  eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
            (&local_2b8,&local_268,&local_218);
  local_178.m_backend.data._M_elems[0] = local_2b8.data._M_elems[0];
  local_178.m_backend.data._M_elems[1] = local_2b8.data._M_elems[1];
  local_178.m_backend.data._M_elems[2] = local_2b8.data._M_elems[2];
  local_178.m_backend.data._M_elems[3] = local_2b8.data._M_elems[3];
  local_178.m_backend.data._M_elems[4] = local_2b8.data._M_elems[4];
  local_178.m_backend.data._M_elems[5] = local_2b8.data._M_elems[5];
  local_178.m_backend.data._M_elems[6] = local_2b8.data._M_elems[6];
  local_178.m_backend.data._M_elems[7] = local_2b8.data._M_elems[7];
  local_178.m_backend.data._M_elems[8] = local_2b8.data._M_elems[8];
  local_178.m_backend.data._M_elems[9] = local_2b8.data._M_elems[9];
  local_178.m_backend.data._M_elems[10] = local_2b8.data._M_elems[10];
  local_178.m_backend.data._M_elems[0xb] = local_2b8.data._M_elems[0xb];
  local_178.m_backend.data._M_elems[0xc] = local_2b8.data._M_elems[0xc];
  local_178.m_backend.data._M_elems[0xd] = local_2b8.data._M_elems[0xd];
  local_178.m_backend.data._M_elems[0xe] = local_2b8.data._M_elems[0xe];
  local_178.m_backend.data._M_elems[0xf] = local_2b8.data._M_elems[0xf];
  local_178.m_backend.exp = local_2b8.exp;
  local_178.m_backend.neg = local_2b8.neg;
  local_178.m_backend.fpclass = local_2b8.fpclass;
  local_178.m_backend.prec_elem = local_2b8.prec_elem;
  (*(this->super_PostStep)._vptr_PostStep[7])(&local_80,this);
  bVar6 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_178,&local_80);
  if (bVar6) {
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)&local_2b8,0.0);
  }
  local_218.fpclass = cpp_dec_float_finite;
  local_218.prec_elem = 0x10;
  local_218.data._M_elems[0] = 0;
  local_218.data._M_elems[1] = 0;
  local_218.data._M_elems[2] = 0;
  local_218.data._M_elems[3] = 0;
  local_218.data._M_elems[4] = 0;
  local_218.data._M_elems[5] = 0;
  local_218.data._M_elems[6] = 0;
  local_218.data._M_elems[7] = 0;
  local_218.data._M_elems[8] = 0;
  local_218.data._M_elems[9] = 0;
  local_218.data._M_elems[10] = 0;
  local_218.data._M_elems[0xb] = 0;
  local_218.data._M_elems[0xc] = 0;
  local_218.data._M_elems[0xd] = 0;
  local_218.data._M_elems._56_5_ = 0;
  local_218.data._M_elems[0xf]._1_3_ = 0;
  local_218.exp = 0;
  local_218.neg = false;
  boost::multiprecision::default_ops::
  eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
            (&local_218,&local_2b8,&local_358);
  local_268.fpclass = cpp_dec_float_finite;
  local_268.prec_elem = 0x10;
  local_268.data._M_elems[0] = 0;
  local_268.data._M_elems[1] = 0;
  local_268.data._M_elems[2] = 0;
  local_268.data._M_elems[3] = 0;
  local_268.data._M_elems[4] = 0;
  local_268.data._M_elems[5] = 0;
  local_268.data._M_elems[6] = 0;
  local_268.data._M_elems[7] = 0;
  local_268.data._M_elems[8] = 0;
  local_268.data._M_elems[9] = 0;
  local_268.data._M_elems[10] = 0;
  local_268.data._M_elems[0xb] = 0;
  local_268.data._M_elems[0xc] = 0;
  local_268.data._M_elems[0xd] = 0;
  local_268.data._M_elems._56_5_ = 0;
  local_268.data._M_elems[0xf]._1_3_ = 0;
  local_268.exp = 0;
  local_268.neg = false;
  boost::multiprecision::default_ops::
  eval_divide_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
            (&local_268,&local_218,&local_1c8);
  iVar2 = this->m_j;
  pnVar3 = (x->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = pnVar3[iVar2].m_backend.data._M_elems + 0xc;
  *(undefined8 *)puVar1 = local_268.data._M_elems._48_8_;
  *(ulong *)(puVar1 + 2) =
       CONCAT35(local_268.data._M_elems[0xf]._1_3_,local_268.data._M_elems._56_5_);
  puVar1 = pnVar3[iVar2].m_backend.data._M_elems + 8;
  *(undefined8 *)puVar1 = local_268.data._M_elems._32_8_;
  *(undefined8 *)(puVar1 + 2) = local_268.data._M_elems._40_8_;
  puVar1 = pnVar3[iVar2].m_backend.data._M_elems + 4;
  *(undefined8 *)puVar1 = local_268.data._M_elems._16_8_;
  *(undefined8 *)(puVar1 + 2) = local_268.data._M_elems._24_8_;
  *(undefined8 *)&pnVar3[iVar2].m_backend.data = local_268.data._M_elems._0_8_;
  *(undefined8 *)(pnVar3[iVar2].m_backend.data._M_elems + 2) = local_268.data._M_elems._8_8_;
  pnVar3[iVar2].m_backend.exp = local_268.exp;
  pnVar3[iVar2].m_backend.neg = local_268.neg;
  pnVar3[iVar2].m_backend.fpclass = local_268.fpclass;
  pnVar3[iVar2].m_backend.prec_elem = local_268.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
            (&(s->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[this->m_i].m_backend,
             &(this->m_lRhs).m_backend);
  local_268.fpclass = cpp_dec_float_finite;
  local_268.prec_elem = 0x10;
  local_268.data._M_elems[0] = 0;
  local_268.data._M_elems[1] = 0;
  local_268.data._M_elems[2] = 0;
  local_268.data._M_elems[3] = 0;
  local_268.data._M_elems[4] = 0;
  local_268.data._M_elems[5] = 0;
  local_268.data._M_elems[6] = 0;
  local_268.data._M_elems[7] = 0;
  local_268.data._M_elems[8] = 0;
  local_268.data._M_elems[9] = 0;
  local_268.data._M_elems[10] = 0;
  local_268.data._M_elems[0xb] = 0;
  local_268.data._M_elems[0xc] = 0;
  local_268.data._M_elems[0xd] = 0;
  local_268.data._M_elems._56_5_ = 0;
  local_268.data._M_elems[0xf]._1_3_ = 0;
  local_268.exp = 0;
  local_268.neg = false;
  boost::multiprecision::default_ops::
  eval_divide_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
            (&local_268,&(this->m_obj).m_backend,&local_1c8);
  iVar2 = this->m_i;
  pnVar3 = (y->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = pnVar3[iVar2].m_backend.data._M_elems + 0xc;
  *(undefined8 *)puVar1 = local_268.data._M_elems._48_8_;
  *(ulong *)(puVar1 + 2) =
       CONCAT35(local_268.data._M_elems[0xf]._1_3_,local_268.data._M_elems._56_5_);
  puVar1 = pnVar3[iVar2].m_backend.data._M_elems + 8;
  *(undefined8 *)puVar1 = local_268.data._M_elems._32_8_;
  *(undefined8 *)(puVar1 + 2) = local_268.data._M_elems._40_8_;
  puVar1 = pnVar3[iVar2].m_backend.data._M_elems + 4;
  *(undefined8 *)puVar1 = local_268.data._M_elems._16_8_;
  *(undefined8 *)(puVar1 + 2) = local_268.data._M_elems._24_8_;
  *(undefined8 *)&pnVar3[iVar2].m_backend.data = local_268.data._M_elems._0_8_;
  *(undefined8 *)(pnVar3[iVar2].m_backend.data._M_elems + 2) = local_268.data._M_elems._8_8_;
  pnVar3[iVar2].m_backend.exp = local_268.exp;
  pnVar3[iVar2].m_backend.neg = local_268.neg;
  pnVar3[iVar2].m_backend.fpclass = local_268.fpclass;
  pnVar3[iVar2].m_backend.prec_elem = local_268.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)
             ((r->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start + this->m_j),0.0);
  cStatus->data[this->m_j] = BASIC;
  if (this->m_eqCons == true) {
    rStatus->data[this->m_i] = FIXED;
  }
  else if (this->m_onLhs == true) {
    rStatus->data[this->m_i] = ON_LOWER;
  }
  else {
    rStatus->data[this->m_i] = ON_UPPER;
  }
  return;
}

Assistant:

void SPxMainSM<R>::FreeColSingletonPS::execute(VectorBase<R>& x, VectorBase<R>& y, VectorBase<R>& s,
      VectorBase<R>& r,
      DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
      DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{

   // correcting the change of idx by deletion of the row:
   if(m_i != m_old_i)
   {
      s[m_old_i] = s[m_i];
      y[m_old_i] = y[m_i];
      rStatus[m_old_i] = rStatus[m_i];
   }

   // correcting the change of idx by deletion of the column:
   if(m_j != m_old_j)
   {
      x[m_old_j] = x[m_j];
      r[m_old_j] = r[m_j];
      cStatus[m_old_j] = cStatus[m_j];
   }

   // primal:
   R val = 0.0;
   R aij = m_row[m_j];

   for(int k = 0; k < m_row.size(); ++k)
   {
      if(m_row.index(k) != m_j)
         val += m_row.value(k) * x[m_row.index(k)];
   }

   R scale = maxAbs(m_lRhs, val);

   if(scale < 1.0)
      scale = 1.0;

   R z = (m_lRhs / scale) - (val / scale);

   if(isZero(z, this->epsilon()))
      z = 0.0;

   x[m_j] = z * scale / aij;
   s[m_i] = m_lRhs;

   // dual:
   y[m_i] = m_obj / aij;
   r[m_j] = 0.0;

   // basis:
   cStatus[m_j] = SPxSolverBase<R>::BASIC;

   if(m_eqCons)
      rStatus[m_i] = SPxSolverBase<R>::FIXED;
   else if(m_onLhs)
      rStatus[m_i] = SPxSolverBase<R>::ON_LOWER;
   else
      rStatus[m_i] = SPxSolverBase<R>::ON_UPPER;

#ifdef SOPLEX_CHECK_BASIS_DIM

   if(!this->checkBasisDim(rStatus, cStatus))
   {
      throw SPxInternalCodeException("XMAISM22 Dimension doesn't match after this step.");
   }

#endif
}